

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O1

void __thiscall
Clone_generateFromClonedModel_Test::TestBody(Clone_generateFromClonedModel_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  PrinterPtr p;
  ModelPtr clonedModel;
  ModelPtr model;
  GeneratorPtr generator;
  AnalyserPtr analyser;
  ParserPtr parser;
  undefined1 local_d8 [16];
  long local_c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  shared_ptr local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  string local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  shared_ptr *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  shared_ptr *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml","");
  fileContents((string *)local_d8);
  libcellml::Parser::parseModel(local_58);
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_88._M_dataplus._M_p = (pointer)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((AssertionResult *)local_d8,(internal *)"size_t(0)","parser->issueCount()",
             (char *)&local_b8,(unsigned_long *)&local_88,(unsigned_long *)in_R9);
  if (local_d8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x1ec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_b8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
      }
      local_b8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_d8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Model::clone();
  compareModel((shared_ptr *)local_58,local_68);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel(local_38);
  libcellml::Generator::create();
  libcellml::Analyser::model();
  libcellml::Generator::setModel(local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"generator/hodgkin_huxley_squid_axon_model_1952/model.c","");
  fileContents((string *)local_d8);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_98,
             (internal *)"fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.c\")",
             "generator->implementationCode()",local_d8,&local_88,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] == false) {
    testing::Message::Message((Message *)local_d8);
    if ((undefined8 *)local_98._8_8_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_98._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x1fa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_d8._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_d8._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_d8._0_8_ + 8))();
      }
      local_d8._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_98 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)local_d8,SUB81(local_88._M_dataplus._M_p,0));
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&local_b8,SUB81(local_88._M_dataplus._M_p,0));
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_98,(internal *)"p->printModel(model)",
             "p->printModel(clonedModel)",local_d8,&local_b8,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((long *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8[0] + 1);
  }
  if (local_98[0] == false) {
    testing::Message::Message((Message *)local_d8);
    if ((undefined8 *)local_98._8_8_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_98._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x1fe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_d8._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_d8._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_d8._0_8_ + 8))();
      }
      local_d8._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_98 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Clone, generateFromClonedModel)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto clonedModel = model->clone();

    compareModel(model, clonedModel);

    libcellml::AnalyserPtr analyser = libcellml::Analyser::create();

    analyser->analyseModel(clonedModel);

    libcellml::GeneratorPtr generator = libcellml::Generator::create();

    generator->setModel(analyser->model());

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.c"), generator->implementationCode());

    libcellml::PrinterPtr p = libcellml::Printer::create();

    EXPECT_EQ(p->printModel(model), p->printModel(clonedModel));
}